

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O0

int __thiscall raspicam::_private::Private_Impl_Still::createCamera(Private_Impl_Still *this)

{
  MMAL_ES_FORMAT_T *pMVar1;
  MMAL_STATUS_T MVar2;
  ostream *poVar3;
  Private_Impl_Still *in_RDI;
  MMAL_ES_FORMAT_T *format;
  MMAL_PARAMETER_CAMERA_CONFIG_T camConfig;
  MMAL_PARAMETER_HEADER_T local_40;
  uint local_38;
  uint local_34;
  undefined4 local_30;
  undefined4 local_2c;
  uint local_28;
  uint local_24;
  undefined4 uVar4;
  undefined4 uVar5;
  int local_4;
  
  MVar2 = mmal_component_create("vc.ril.camera",&in_RDI->camera);
  if (MVar2 == MMAL_SUCCESS) {
    if (in_RDI->camera->output_num == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,in_RDI->API_NAME);
      std::operator<<(poVar3,": Camera does not have output ports!\n");
      destroyCamera(in_RDI);
      local_4 = -1;
    }
    else {
      in_RDI->camera_still_port = in_RDI->camera->output[2];
      MVar2 = mmal_port_enable(in_RDI->camera->control,control_callback);
      if (MVar2 == MMAL_SUCCESS) {
        local_40.id = 0x10015;
        local_40.size = 0x30;
        local_38 = in_RDI->width;
        local_34 = in_RDI->height;
        local_30 = 0;
        local_2c = 1;
        local_28 = in_RDI->width;
        local_24 = in_RDI->height;
        uVar4 = 3;
        uVar5 = 0;
        MVar2 = mmal_port_parameter_set(in_RDI->camera->control,&local_40);
        if (MVar2 != MMAL_SUCCESS) {
          poVar3 = std::operator<<((ostream *)&std::cout,in_RDI->API_NAME);
          std::operator<<(poVar3,": Could not set port parameters.\n");
        }
        commitParameters((Private_Impl_Still *)CONCAT44(uVar5,uVar4));
        pMVar1 = in_RDI->camera_still_port->format;
        pMVar1->encoding = 0x5651504f;
        (pMVar1->es->audio).channels = in_RDI->width;
        (pMVar1->es->audio).sample_rate = in_RDI->height;
        (pMVar1->es->audio).bits_per_sample = 0;
        (pMVar1->es->audio).block_align = 0;
        (pMVar1->es->video).crop.width = in_RDI->width;
        (pMVar1->es->video).crop.height = in_RDI->height;
        (pMVar1->es->video).frame_rate.num = 3;
        (pMVar1->es->video).frame_rate.den = 1;
        if (in_RDI->camera_still_port->buffer_size < in_RDI->camera_still_port->buffer_size_min) {
          in_RDI->camera_still_port->buffer_size = in_RDI->camera_still_port->buffer_size_min;
        }
        in_RDI->camera_still_port->buffer_num = in_RDI->camera_still_port->buffer_num_recommended;
        MVar2 = mmal_port_format_commit(in_RDI->camera_still_port);
        if (MVar2 == MMAL_SUCCESS) {
          MVar2 = mmal_component_enable(in_RDI->camera);
          if (MVar2 == MMAL_SUCCESS) {
            local_4 = 0;
          }
          else {
            poVar3 = std::operator<<((ostream *)&std::cout,in_RDI->API_NAME);
            std::operator<<(poVar3,": Camera component could not be enabled.\n");
            destroyCamera(in_RDI);
            local_4 = -1;
          }
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cout,in_RDI->API_NAME);
          std::operator<<(poVar3,": Camera still format could not be set.\n");
          destroyCamera(in_RDI);
          local_4 = -1;
        }
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,in_RDI->API_NAME);
        std::operator<<(poVar3,": Could not enable control port.\n");
        destroyCamera(in_RDI);
        local_4 = -1;
      }
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,in_RDI->API_NAME);
    std::operator<<(poVar3,": Failed to create camera component.\n");
    destroyCamera(in_RDI);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int Private_Impl_Still::createCamera() {
            if ( mmal_component_create ( MMAL_COMPONENT_DEFAULT_CAMERA, &camera ) ) {
                cout << API_NAME << ": Failed to create camera component.\n";
                destroyCamera();
                return -1;
            }

            if ( !camera->output_num ) {
                cout << API_NAME << ": Camera does not have output ports!\n";
                destroyCamera();
                return -1;
            }

            camera_still_port = camera->output[MMAL_CAMERA_CAPTURE_PORT];

            // Enable the camera, and tell it its control callback function
            if ( mmal_port_enable ( camera->control, control_callback ) ) {
                cout << API_NAME << ": Could not enable control port.\n";
                destroyCamera();
                return -1;
            }

            MMAL_PARAMETER_CAMERA_CONFIG_T camConfig = {
                {MMAL_PARAMETER_CAMERA_CONFIG, sizeof ( camConfig ) },
                width, // max_stills_w
                height, // max_stills_h
                0, // stills_yuv422
                1, // one_shot_stills
                width, // max_preview_video_w
                height, // max_preview_video_h
                3, // num_preview_video_frames
                0, // stills_capture_circular_buffer_height
                0, // fast_preview_resume
                MMAL_PARAM_TIMESTAMP_MODE_RESET_STC // use_stc_timestamp
            };
            if ( mmal_port_parameter_set ( camera->control, &camConfig.hdr ) != MMAL_SUCCESS )
                cout << API_NAME << ": Could not set port parameters.\n";

            commitParameters();

            MMAL_ES_FORMAT_T * format = camera_still_port->format;
            format->encoding = MMAL_ENCODING_OPAQUE;
            format->es->video.width = width;
            format->es->video.height = height;
            format->es->video.crop.x = 0;
            format->es->video.crop.y = 0;
            format->es->video.crop.width = width;
            format->es->video.crop.height = height;
            format->es->video.frame_rate.num = STILLS_FRAME_RATE_NUM;
            format->es->video.frame_rate.den = STILLS_FRAME_RATE_DEN;

            if ( camera_still_port->buffer_size < camera_still_port->buffer_size_min )
                camera_still_port->buffer_size = camera_still_port->buffer_size_min;

            camera_still_port->buffer_num = camera_still_port->buffer_num_recommended;

            if ( mmal_port_format_commit ( camera_still_port ) ) {
                cout << API_NAME << ": Camera still format could not be set.\n";
                destroyCamera();
                return -1;
            }

            if ( mmal_component_enable ( camera ) ) {
                cout << API_NAME << ": Camera component could not be enabled.\n";
                destroyCamera();
                return -1;
            }

            // This is the reason I could not free fully the camera because this pool could never be freed since 
            // the pointer encoder_pool was reassigned in createEncoder function, we lost its reference
            // so this allocation is useless or misused -> camera_pool ?
            /*if ( ! ( encoder_pool = mmal_port_pool_create ( camera_still_port, camera_still_port->buffer_num, camera_still_port->buffer_size ) ) ) {
                    cout << API_NAME << ": Failed to create buffer header pool for camera.\n";
                    destroyCamera();
                    return -1;
            }*/

            return 0;
        }